

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O2

void_t<typename_unique_ptr<unique_ptr<int>_>::element_type>
mserialize::detail::
BuiltinDeserializer<std::unique_ptr<std::unique_ptr<int,std::default_delete<int>>,std::default_delete<std::unique_ptr<int,std::default_delete<int>>>>,void>
::
make_nonempty<std::unique_ptr<std::unique_ptr<int,std::default_delete<int>>,std::default_delete<std::unique_ptr<int,std::default_delete<int>>>>>
          (unique_ptr<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           *ptr)

{
  pointer __p;
  
  __p = (pointer)operator_new(8);
  (__p->_M_t).super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
  super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
  _M_head_impl = (int *)0x0;
  std::
  __uniq_ptr_impl<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
  ::reset((__uniq_ptr_impl<std::unique_ptr<int,_std::default_delete<int>_>,_std::default_delete<std::unique_ptr<int,_std::default_delete<int>_>_>_>
           *)ptr,__p);
  return;
}

Assistant:

static void_t<typename SmartPtr::element_type> make_nonempty(SmartPtr& ptr)
  {
    using T = typename SmartPtr::element_type;
    ptr.reset(new T{}); // NOLINT(cppcoreguidelines-owning-memory)
  }